

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

size_type __thiscall re2::StringPiece::rfind(StringPiece *this,StringPiece *s,size_type pos)

{
  int iVar1;
  char *pcVar2;
  size_type sVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  
  uVar5 = (ulong)this->length_;
  iVar1 = s->length_;
  lVar4 = (long)iVar1;
  sVar3 = 0xffffffffffffffff;
  if (iVar1 <= this->length_) {
    if (iVar1 == 0) {
      sVar3 = pos;
      if (uVar5 < pos) {
        sVar3 = uVar5;
      }
    }
    else {
      uVar6 = uVar5 - lVar4;
      if (pos <= uVar5 - lVar4) {
        uVar6 = pos;
      }
      pcVar7 = this->ptr_ + lVar4 + uVar6;
      pcVar2 = std::__find_end<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (this->ptr_,pcVar7,s->ptr_,s->ptr_ + lVar4);
      sVar3 = 0xffffffffffffffff;
      if (pcVar2 != pcVar7) {
        sVar3 = (long)pcVar2 - (long)this->ptr_;
      }
    }
  }
  return sVar3;
}

Assistant:

StringPiece::size_type StringPiece::rfind(const StringPiece& s,
                                          size_type pos) const {
  if (length_ < s.length_) return npos;
  const size_type ulen = length_;
  if (s.length_ == 0) return min(ulen, pos);

  const char* last = ptr_ + min(ulen - s.length_, pos) + s.length_;
  const char* result = std::find_end(ptr_, last, s.ptr_, s.ptr_ + s.length_);
  return result != last ? result - ptr_ : npos;
}